

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O2

GLRState * __thiscall GLRParser::findState(GLRParser *this,string *stateName)

{
  bool bVar1;
  __type _Var2;
  _Base_ptr p_Var3;
  GLRState *pGVar4;
  
  bVar1 = std::operator==(stateName,"accept");
  if (bVar1) {
    pGVar4 = this->acceptState;
  }
  else {
    for (p_Var3 = (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->states)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      pGVar4 = *(GLRState **)(p_Var3 + 1);
      _Var2 = std::operator==(&pGVar4->name,stateName);
      if (_Var2) {
        return pGVar4;
      }
    }
    pGVar4 = (GLRState *)0x0;
  }
  return pGVar4;
}

Assistant:

GLRState *GLRParser::findState(const std::string &stateName) {
//    return *std::find(states.begin(), states.end(), stateName);
    if (stateName == "accept") {
        return acceptState;
    }


    for (GLRState *state: states) {
        if (state->getName() == stateName) {
            return state;
        }
    }


    return nullptr;
}